

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::
SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>::
emplace_back<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
          (SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
           *this,unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                 *args)

{
  long lVar1;
  ulong uVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  long lVar6;
  EVP_PKEY_CTX *pEVar7;
  ulong *puVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  
  lVar1 = *(long *)(this + 8);
  puVar8 = (ulong *)(lVar1 * 8 + *(long *)this);
  if (lVar1 != *(long *)(this + 0x10)) {
    *puVar8 = (ulong)(args->_M_t).
                     super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                     .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
    (args->_M_t).
    super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>._M_t.
    super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
    super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
    *(long *)(this + 8) = lVar1 + 1;
    return (reference)(*(long *)this + lVar1 * 8);
  }
  if (*(long *)(this + 8) == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar2 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0xfffffffffffffff - uVar2 < uVar2) {
    pEVar7 = (EVP_PKEY_CTX *)0xfffffffffffffff;
  }
  lVar9 = (long)puVar8 - *(long *)this;
  puVar3 = (ulong *)operator_new((long)pEVar7 * 8);
  *(Lexer **)((long)puVar3 + lVar9) =
       (args->_M_t).
       super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
       _M_t.
       super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
       super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
  (args->_M_t).
  super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>._M_t.
  super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
  super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
  puVar4 = *(ulong **)this;
  lVar1 = *(long *)(this + 8);
  puVar5 = puVar3;
  if (puVar4 + lVar1 == puVar8) {
    if (lVar1 != 0) {
      lVar6 = 0;
      do {
        ctx = *(EVP_PKEY_CTX **)((long)puVar4 + lVar6);
        *(EVP_PKEY_CTX **)((long)puVar3 + lVar6) = ctx;
        *(undefined8 *)((long)puVar4 + lVar6) = 0;
        lVar6 = lVar6 + 8;
      } while (lVar1 << 3 != lVar6);
    }
  }
  else {
    for (; puVar4 != puVar8; puVar4 = puVar4 + 1) {
      ctx = (EVP_PKEY_CTX *)*puVar4;
      *puVar5 = (ulong)ctx;
      *puVar4 = 0;
      puVar5 = puVar5 + 1;
    }
    puVar4 = (ulong *)(lVar1 * 8 + *(long *)this);
    if (puVar4 != puVar8) {
      puVar5 = (ulong *)(lVar9 + (long)puVar3);
      do {
        puVar5 = puVar5 + 1;
        *puVar5 = *puVar8;
        *puVar8 = 0;
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar4);
    }
  }
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  ::cleanup((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
             *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar7;
  *(ulong **)this = puVar3;
  return (reference)((long)puVar3 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }